

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

int __thiscall ImGuiStorage::GetInt(ImGuiStorage *this,ImGuiID key,int default_val)

{
  iterator pvVar1;
  
  pvVar1 = LowerBound(&this->Data,key);
  if ((pvVar1 != (this->Data).Data + (this->Data).Size) && (pvVar1->key == key)) {
    default_val = (pvVar1->field_1).val_i;
  }
  return default_val;
}

Assistant:

int ImGuiStorage::GetInt(ImGuiID key, int default_val) const
{
    ImVector<Pair>::iterator it = LowerBound(const_cast<ImVector<ImGuiStorage::Pair>&>(Data), key);
    if (it == Data.end() || it->key != key)
        return default_val;
    return it->val_i;
}